

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_lha.c
# Opt level: O0

int verify(EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  wchar_t wVar1;
  archive *v2;
  time_t tVar2;
  char *file;
  uint uVar3;
  size_t i;
  archive_entry *ae;
  archive *a;
  archive *in_stack_ffffffffffffff78;
  archive *paVar4;
  archive_entry *entry;
  void *extra;
  archive_entry **entry_00;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 uVar5;
  uint in_stack_ffffffffffffff84;
  wchar_t in_stack_ffffffffffffff88;
  wchar_t in_stack_ffffffffffffff8c;
  archive *in_stack_ffffffffffffff90;
  char *e1;
  char *in_stack_ffffffffffffff98;
  char *file_00;
  void *in_stack_ffffffffffffffb0;
  fns *fns;
  undefined8 uVar6;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  wchar_t in_stack_ffffffffffffffc8;
  ulong uVar7;
  archive_entry *local_30;
  
  uVar3 = (uint)siglen;
  v2 = archive_read_new();
  assertion_assert((char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
                   in_stack_ffffffffffffff88,
                   (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   in_stack_ffffffffffffff78);
  archive_read_support_format_all(in_stack_ffffffffffffff78);
  paVar4 = v2;
  assertion_equal_int(in_stack_ffffffffffffff98,(wchar_t)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                      (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                      (longlong)v2,(char *)0x1fc239,in_stack_ffffffffffffffb0);
  archive_read_support_filter_all(paVar4);
  paVar4 = v2;
  assertion_equal_int(in_stack_ffffffffffffff98,(wchar_t)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                      (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                      (longlong)v2,(char *)0x1fc272,in_stack_ffffffffffffffb0);
  if (uVar3 != 0) {
    archive_read_set_option
              (in_stack_ffffffffffffff90,
               (char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
               (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),(char *)paVar4)
    ;
    assertion_assert((char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
                     in_stack_ffffffffffffff88,
                     (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),paVar4);
  }
  if (1 < uVar3) {
    archive_read_set_option
              (in_stack_ffffffffffffff90,
               (char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
               (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),(char *)paVar4)
    ;
    assertion_assert((char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
                     in_stack_ffffffffffffff88,
                     (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),paVar4);
  }
  archive_read_open_memory
            ((archive *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),paVar4,
             0x1fc31d);
  uVar6 = 0;
  file_00 = "0";
  e1 = (char *)0x0;
  paVar4 = v2;
  assertion_equal_int("0",L'\0',CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                      (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                      (longlong)v2,(char *)0x1fc35d,in_stack_ffffffffffffffb0);
  archive_read_next_header
            ((archive *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             (archive_entry **)paVar4);
  assertion_equal_int(file_00,(wchar_t)((ulong)e1 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                      (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                      (longlong)v2,(char *)0x1fc39a,in_stack_ffffffffffffffb0);
  tVar2 = archive_entry_atime(local_30);
  wVar1 = (wchar_t)((ulong)tVar2 >> 0x20);
  archive_entry_ctime(local_30);
  fns = (fns *)0x2e5ddc;
  assertion_equal_int(file_00,(wchar_t)((ulong)e1 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                      (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),0,
                      (char *)0x1fc3e7,"archive_entry_atime(ae)");
  file = (char *)archive_entry_atime(local_30);
  archive_entry_mtime(local_30);
  entry = (archive_entry *)0x0;
  assertion_equal_int(file_00,(wchar_t)((ulong)e1 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                      (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),0,
                      (char *)0x1fc42d,fns);
  archive_entry_pathname(entry);
  uVar5 = 0;
  extra = (void *)0x0;
  assertion_equal_string
            (file,wVar1,file_00,e1,
             (char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
             (char *)((ulong)in_stack_ffffffffffffff84 << 0x20),
             (void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffc8);
  if (uVar3 == 0) {
    archive_entry_mode(local_30);
    assertion_assert(e1,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,
                     (char *)CONCAT44(in_stack_ffffffffffffff84,uVar5),extra);
  }
  else if (uVar3 == 1) {
    archive_entry_mode(local_30);
    assertion_assert(e1,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,
                     (char *)CONCAT44(in_stack_ffffffffffffff84,uVar5),extra);
  }
  else if (uVar3 == 2) {
    archive_entry_mode(local_30);
    assertion_assert(e1,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,
                     (char *)CONCAT44(in_stack_ffffffffffffff84,uVar5),extra);
  }
  memset(*(void **)(tbs + 0x30),0,*(long *)(tbs + 0x20) << 3);
  tbs[0x28] = '\0';
  tbs[0x29] = '\0';
  tbs[0x2a] = '\0';
  tbs[0x2b] = '\0';
  for (uVar7 = 0; uVar7 < *(ulong *)(tbs + 0x20); uVar7 = uVar7 + 1) {
    verify_file((archive *)CONCAT44(uVar3,in_stack_ffffffffffffffc0),(vtype)((ulong)uVar6 >> 0x20),
                fns);
  }
  for (uVar7 = 0; wVar1 = (wchar_t)((ulong)e1 >> 0x20), uVar7 < *(ulong *)(tbs + 0x20);
      uVar7 = uVar7 + 1) {
    free(*(void **)(*(long *)(tbs + 0x30) + uVar7 * 8));
  }
  entry_00 = (archive_entry **)0x0;
  assertion_equal_int(file_00,wVar1,CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                      (char *)CONCAT44(in_stack_ffffffffffffff84,uVar5),0,(char *)0x1fc627,fns);
  archive_read_next_header((archive *)CONCAT44(in_stack_ffffffffffffff84,uVar5),entry_00);
  assertion_equal_int(file_00,wVar1,CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                      (char *)CONCAT44(in_stack_ffffffffffffff84,uVar5),(longlong)v2,
                      (char *)0x1fc666,fns);
  archive_read_close((archive *)0x1fc670);
  assertion_equal_int(file_00,wVar1,CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                      (char *)CONCAT44(in_stack_ffffffffffffff84,uVar5),(longlong)v2,
                      (char *)0x1fc69f,fns);
  archive_read_free((archive *)0x1fc6a9);
  wVar1 = assertion_equal_int(file_00,wVar1,
                              CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                              (char *)CONCAT44(in_stack_ffffffffffffff84,uVar5),(longlong)v2,
                              (char *)0x1fc6d8,fns);
  return wVar1;
}

Assistant:

static void
verify(const char *refname, int posix)
{
	struct archive_entry *ae;
	struct archive *a;
	char buff[128];
	const void *pv;
	size_t s;
	int64_t o;
	int uid, gid;

	if (posix)
		uid = gid = 1001;
	else
		uid = gid = 0;

	extract_reference_file(refname);
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_filename(a, refname, 10240));

	/* Verify directory1.  */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	if (posix)
		assertEqualInt((AE_IFDIR | 0750), archive_entry_mode(ae));
	else
		assertEqualInt((AE_IFDIR | 0755), archive_entry_mode(ae));
	assertEqualString("dir/", archive_entry_pathname(ae));
	assertEqualInt(86401, archive_entry_mtime(ae));
	assertEqualInt(uid, archive_entry_uid(ae));
	assertEqualInt(gid, archive_entry_gid(ae));
	assertEqualInt(0, archive_entry_size(ae));
	assertEqualIntA(a, ARCHIVE_EOF,
	    archive_read_data_block(a, &pv, &s, &o));
	assertEqualInt(s, 0);
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	/* Verify directory2.  */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt((AE_IFDIR | 0755), archive_entry_mode(ae));
	assertEqualString("dir2/", archive_entry_pathname(ae));
	assertEqualInt(86401, archive_entry_mtime(ae));
	assertEqualInt(uid, archive_entry_uid(ae));
	assertEqualInt(gid, archive_entry_gid(ae));
	assertEqualInt(0, archive_entry_size(ae));
	assertEqualIntA(a, ARCHIVE_EOF,
	    archive_read_data_block(a, &pv, &s, &o));
	assertEqualInt(s, 0);
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	if (posix) {
		/* Verify symbolic link file1. */
		assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
		assertEqualInt((AE_IFLNK | 0755), archive_entry_mode(ae));
		assertEqualString("dir2/symlink1", archive_entry_pathname(ae));
		assertEqualString("../file1", archive_entry_symlink(ae));
		assertEqualInt(172802, archive_entry_mtime(ae));
		assertEqualInt(uid, archive_entry_uid(ae));
		assertEqualInt(gid, archive_entry_gid(ae));
		assertEqualInt(0, archive_entry_size(ae));
		assertEqualInt(archive_entry_is_encrypted(ae), 0);
		assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

		/* Verify symbolic link file2. */
		assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
		assertEqualInt((AE_IFLNK | 0755), archive_entry_mode(ae));
		assertEqualString("dir2/symlink2", archive_entry_pathname(ae));
		assertEqualString("../file2", archive_entry_symlink(ae));
		assertEqualInt(172802, archive_entry_mtime(ae));
		assertEqualInt(uid, archive_entry_uid(ae));
		assertEqualInt(gid, archive_entry_gid(ae));
		assertEqualInt(0, archive_entry_size(ae));
		assertEqualInt(archive_entry_is_encrypted(ae), 0);
		assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);
	}

	/* Verify regular file1. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt((AE_IFREG | 0644), archive_entry_mode(ae));
	assertEqualString("file1", archive_entry_pathname(ae));
	assertEqualInt(86401, archive_entry_mtime(ae));
	assertEqualInt(uid, archive_entry_uid(ae));
	assertEqualInt(gid, archive_entry_gid(ae));
	assertEqualInt(file1_size, archive_entry_size(ae));
	assertEqualInt(file1_size, archive_read_data(a, buff, file1_size));
	assertEqualMem(buff, file1, file1_size);
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	/* Verify regular file2. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	if (posix)
		assertEqualInt((AE_IFREG | 0666), archive_entry_mode(ae));
	else
		assertEqualInt((AE_IFREG | 0644), archive_entry_mode(ae));
	assertEqualString("file2", archive_entry_pathname(ae));
	assertEqualInt(86401, archive_entry_mtime(ae));
	assertEqualInt(uid, archive_entry_uid(ae));
	assertEqualInt(gid, archive_entry_gid(ae));
	assertEqualInt(file2_size, archive_entry_size(ae));
	assertEqualInt(file2_size, archive_read_data(a, buff, file2_size));
	assertEqualMem(buff, file2, file2_size);
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	/* Verify the number of files read. */
	if (posix) {
		assertEqualInt(6, archive_file_count(a));
	} else {
		assertEqualInt(4, archive_file_count(a));
	}

	/* End of archive. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify the number of files read. */
	if (posix) {
		assertEqualInt(6, archive_file_count(a));
	} else {
		assertEqualInt(4, archive_file_count(a));
	}

	/* Verify encryption status */
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	/* Verify archive format. */
	assertEqualIntA(a, ARCHIVE_FILTER_NONE, archive_filter_code(a, 0));
	assertEqualIntA(a, ARCHIVE_FORMAT_LHA, archive_format(a));

	/* Close the archive. */
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}